

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifcvtstr(bifcxdef *ctx,_func_void_uchar_ptr_int *cvtfn,int argc)

{
  long lVar1;
  void *p_00;
  code *in_RSI;
  long in_RDI;
  runsdef *unaff_retaddr;
  runsdef *in_stack_00000008;
  runsdef stkval;
  runsdef val;
  int len;
  uchar *p;
  int in_stack_ffffffffffffffac;
  runcxdef *in_stack_ffffffffffffffb0;
  runsdef local_38;
  uint local_24;
  void *local_20;
  code *local_10;
  long local_8;
  
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
  if (*(char *)(lVar1 + -0x10) == '\x03') {
    p_00 = *(void **)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
    local_20 = p_00;
    local_10 = in_RSI;
    local_8 = in_RDI;
    local_24 = osrp2(p_00);
    if ((uint)((int)*(undefined8 *)(*(long *)(local_8 + 8) + 0x40) -
              (int)*(undefined8 *)(*(long *)(local_8 + 8) + 0x38)) <= local_24) {
      runhcmp((runcxdef *)val._0_8_,stkval.runsv.runsvnum._4_4_,stkval.runsv.runsvnum._0_4_,
              (runsdef *)stkval._0_8_,in_stack_00000008,unaff_retaddr);
    }
    local_20 = p_00;
    memcpy(*(void **)(*(long *)(local_8 + 8) + 0x38),p_00,(long)(int)local_24);
    (*local_10)(*(long *)(*(long *)(local_8 + 8) + 0x38) + 2,local_24 - 2);
    local_38.runsv = *(anon_union_8_4_1dda36f5_for_runsv *)(*(long *)(local_8 + 8) + 0x38);
    local_38.runstyp = '\x03';
    *(long *)(*(long *)(local_8 + 8) + 0x38) =
         *(long *)(*(long *)(local_8 + 8) + 0x38) + (long)(int)local_24;
    runrepush(*(runcxdef **)(local_8 + 8),&local_38);
    return;
  }
  *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
  runsign(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
}

Assistant:

static void bifcvtstr(bifcxdef *ctx, void (*cvtfn)(uchar *, int), int argc)
{
    uchar   *p;
    int      len;
    runsdef  val;
    runsdef  stkval;
    
    bifcntargs(ctx, 1, argc);
    bifchkarg(ctx, DAT_SSTRING);
    
    p = runpopstr(ctx->bifcxrun);
    stkval.runstyp = DAT_SSTRING;
    stkval.runsv.runsvstr = p;
    len = osrp2(p);
    
    /* allocate space in heap for the string and convert */
    runhres1(ctx->bifcxrun, len, 1, &stkval);
    p = stkval.runsv.runsvstr;
    memcpy(ctx->bifcxrun->runcxhp, p, (size_t)len);
    (*cvtfn)(ctx->bifcxrun->runcxhp + 2, len - 2);
    
    val.runsv.runsvstr = ctx->bifcxrun->runcxhp;
    val.runstyp = DAT_SSTRING;
    ctx->bifcxrun->runcxhp += len;
    runrepush(ctx->bifcxrun, &val);
}